

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O3

double ApprovalFileLog::log(double __x)

{
  ostream *poVar1;
  undefined8 *in_RDI;
  double dVar2;
  ofstream ofs;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  initialize();
  getLogFilePath_abi_cxx11_();
  std::ofstream::ofstream(&local_210,(string *)local_230,_S_app);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0]);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_210,(char *)*in_RDI,in_RDI[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _waitpid;
  std::filebuf::~filebuf(local_208);
  dVar2 = (double)std::ios_base::~ios_base(local_118);
  return dVar2;
}

Assistant:

void ApprovalFileLog::log(const std::string& filePath)
{
    initialize();
    std::ofstream ofs(getLogFilePath(), std::ios::app);
    ofs << filePath << std::endl;
}